

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O1

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CWhileStm *stm)

{
  IExpression *pIVar1;
  IStatement *pIVar2;
  
  pIVar1 = (stm->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  pIVar2 = (stm->statement)._M_t.super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>
           ._M_t.super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  if (pIVar2 != (IStatement *)0x0) {
    (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    return;
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CWhileStm &stm )
{
	if( stm.conditionExpression ) {
		stm.conditionExpression->Accept( *this );
	}
	if( stm.statement ) {
		stm.statement->Accept( *this );
	}
}